

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::stack
          (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *this,Callbacks *cb)

{
  pfn_allocate p_Var1;
  pfn_free p_Var2;
  pfn_error p_Var3;
  long lVar4;
  
  lVar4 = 0;
  memset(this,0,0x300);
  do {
    *(undefined8 *)((long)&this->m_buf[0].type.type + lVar4) = 0;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x300);
  this->m_stack = this->m_buf;
  this->m_size = 0;
  this->m_capacity = 0x10;
  p_Var1 = cb->m_allocate;
  p_Var2 = cb->m_free;
  p_Var3 = cb->m_error;
  (this->m_callbacks).m_user_data = cb->m_user_data;
  (this->m_callbacks).m_allocate = p_Var1;
  (this->m_callbacks).m_free = p_Var2;
  (this->m_callbacks).m_error = p_Var3;
  return;
}

Assistant:

stack(Callbacks const& cb)
        : m_buf()
        , m_stack(m_buf)
        , m_size(0)
        , m_capacity(N)
        , m_callbacks(cb) {}